

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O3

void test_common<unsigned_char>(uint length,uchar value)

{
  ulong __n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __s;
  uint i;
  void *__s_00;
  ulong uVar1;
  undefined8 *puVar2;
  shared_ptr<unsigned_char> pa;
  shared_ptr<unsigned_char> pb;
  
  __n = (ulong)length;
  __s_00 = operator_new__((long)(int)(length + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_char*,void(*)(unsigned_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,__s_00,
             nosimd::common::free<unsigned_char>);
  pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__((long)(int)(length + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_char*,void(*)(unsigned_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<unsigned_char>);
  __s._M_pi = pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(undefined1 *)((long)__s_00 + __n) = 0x7f;
  *(undefined1 *)
   ((long)&(pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + __n) = 0x3f;
  if ((int)length < 1) {
    if (length == 0) goto LAB_001054ff;
  }
  else {
    memset(__s_00,(uint)value,__n);
  }
  uVar1 = 0;
  do {
    if (*(uchar *)((long)__s_00 + uVar1) != value) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar2 = "void test_common(unsigned int, T) [T = unsigned char]";
      *(undefined4 *)(puVar2 + 1) = 0x16;
      *(uint *)((long)puVar2 + 0xc) = length;
      __cxa_throw(puVar2,&Exception::typeinfo,0);
    }
    uVar1 = uVar1 + 1;
  } while (__n != uVar1);
  if (0 < (int)length) {
    uVar1 = 0;
    do {
      *(undefined1 *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar1) =
           *(undefined1 *)((long)__s_00 + uVar1);
      uVar1 = uVar1 + 1;
    } while (__n != uVar1);
  }
  uVar1 = 0;
  do {
    if (*(uchar *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar1) != value) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar2 = "void test_common(unsigned int, T) [T = unsigned char]";
      *(undefined4 *)(puVar2 + 1) = 0x1d;
      *(uint *)((long)puVar2 + 0xc) = length;
      __cxa_throw(puVar2,&Exception::typeinfo,0);
    }
    uVar1 = uVar1 + 1;
  } while (__n != uVar1);
  if (0 < (int)length) {
    memset(__s._M_pi,0,__n);
  }
  uVar1 = 0;
  do {
    if (*(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar1) != '\0') {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar2 = "void test_common(unsigned int, T) [T = unsigned char]";
      *(undefined4 *)(puVar2 + 1) = 0x24;
      *(uint *)((long)puVar2 + 0xc) = length;
      __cxa_throw(puVar2,&Exception::typeinfo,0);
    }
    uVar1 = uVar1 + 1;
  } while (__n != uVar1);
  uVar1 = 0;
  do {
    *(char *)((long)__s_00 + uVar1) = (char)uVar1;
    uVar1 = uVar1 + 1;
  } while (__n != uVar1);
  if (0 < (int)length) {
    uVar1 = 0;
    do {
      *(undefined1 *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar1) =
           *(undefined1 *)((long)__s_00 + uVar1);
      uVar1 = uVar1 + 1;
    } while (__n != uVar1);
  }
  uVar1 = 0;
  do {
    if ((char)uVar1 != *(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar1)) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar2 = "void test_common(unsigned int, T) [T = unsigned char]";
      *(undefined4 *)(puVar2 + 1) = 0x2d;
      *(uint *)((long)puVar2 + 0xc) = length;
      __cxa_throw(puVar2,&Exception::typeinfo,0);
    }
    uVar1 = uVar1 + 1;
  } while (__n != uVar1);
LAB_001054ff:
  if ((*(char *)((long)__s_00 + __n) == '\x7f') &&
     (*(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + __n) == '?')) {
    if (pb.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = "void test_common(unsigned int, T) [T = unsigned char]";
  *(undefined4 *)(puVar2 + 1) = 0x31;
  *(uint *)((long)puVar2 + 0xc) = length;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}